

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O3

void __thiscall duckdb::ColumnSegment::~ColumnSegment(ColumnSegment *this)

{
  _Head_base<0UL,_duckdb::CompressedSegmentState_*,_false> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  _Var1._M_head_impl =
       (this->segment_state).
       super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
       .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (CompressedSegmentState *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_CompressedSegmentState[1])();
  }
  (this->segment_state).
  super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
  .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl =
       (CompressedSegmentState *)0x0;
  this_00 = (this->block).internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  BaseStatistics::~BaseStatistics(&(this->stats).statistics);
  LogicalType::~LogicalType(&this->type);
  return;
}

Assistant:

ColumnSegment::~ColumnSegment() {
}